

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  Btree *pBtree;
  BtShared *pBt_00;
  long lVar1;
  MemPage *pPage_00;
  uchar *pCell;
  ushort uVar2;
  int iVar3;
  uchar *pCell_00;
  void *pvVar4;
  long lVar5;
  undefined1 local_90 [8];
  CellInfo info;
  UnpackedRecord r;
  uchar *newCell;
  uchar *oldCell;
  BtShared *pBt;
  Btree *p;
  MemPage *pPage;
  int idx;
  int szNew;
  int loc;
  int rc;
  int seekResult_local;
  int flags_local;
  BtreePayload *pX_local;
  BtCursor *pCur_local;
  
  pPage._4_4_ = 0;
  pBtree = pCur->pBtree;
  pBt_00 = pBtree->pBt;
  if (pCur->eState == '\x04') {
    return pCur->skipNext;
  }
  idx = seekResult;
  loc = seekResult;
  rc = flags;
  _seekResult_local = pX;
  pX_local = (BtreePayload *)pCur;
  if ((pCur->curFlags & 0x20) != 0) {
    iVar3 = saveAllCursors(pBt_00,pCur->pgnoRoot,pCur);
    if (iVar3 != 0) {
      return iVar3;
    }
    szNew = 0;
  }
  if (pX_local[2].pKey == (void *)0x0) {
    invalidateIncrblobCursors(pBtree,_seekResult_local->nKey,0);
    if (((pX_local[1].nData & 2) == 0) ||
       (lVar5._0_2_ = pX_local->nMem, lVar5._2_2_ = *(undefined2 *)&pX_local->field_0x22,
       lVar5._4_4_ = pX_local->nData, _seekResult_local->nKey != lVar5)) {
      if (((pX_local[1].nData & 2) == 0) ||
         ((_seekResult_local->nKey < 1 ||
          (lVar1._0_2_ = pX_local->nMem, lVar1._2_2_ = *(undefined2 *)&pX_local->field_0x22,
          lVar1._4_4_ = pX_local->nData, lVar1 != _seekResult_local->nKey + -1)))) {
        if (idx == 0) {
          iVar3 = sqlite3BtreeMovetoUnpacked
                            ((BtCursor *)pX_local,(UnpackedRecord *)0x0,_seekResult_local->nKey,
                             (uint)(rc != 0),&idx);
          if (iVar3 != 0) {
            return iVar3;
          }
          szNew = 0;
        }
      }
      else {
        idx = -1;
      }
    }
    else {
      idx = 0;
    }
  }
  else if ((idx == 0) && ((rc & 2U) == 0)) {
    if (_seekResult_local->nMem == 0) {
      szNew = btreeMoveto((BtCursor *)pX_local,_seekResult_local->pKey,_seekResult_local->nKey,
                          (uint)(rc != 0),&idx);
    }
    else {
      info._16_8_ = pX_local[2].pKey;
      szNew = sqlite3BtreeMovetoUnpacked
                        ((BtCursor *)pX_local,(UnpackedRecord *)&info.nPayload,0,(uint)(rc != 0),
                         &idx);
    }
    if (szNew != 0) {
      return szNew;
    }
  }
  pPage_00 = (MemPage *)(&pX_local[3].nKey)[(char)pX_local[1].nZero];
  pCell = pBt_00->pTmpSpace;
  szNew = fillInCell(pPage_00,pCell,_seekResult_local,(int *)((long)&pPage + 4));
  if (szNew != 0) {
    return szNew;
  }
  pPage._0_4_ = (uint)*(ushort *)((long)&pX_local[2].pData + (long)(char)pX_local[1].nZero * 2);
  if (idx == 0) {
    szNew = sqlite3PagerWrite(pPage_00->pDbPage);
    if (szNew != 0) {
      return szNew;
    }
    pCell_00 = pPage_00->aData +
               (int)(uint)(pPage_00->maskPage &
                          CONCAT11(pPage_00->aCellIdx[(int)((uint)pPage << 1)],
                                   pPage_00->aCellIdx[(long)(int)((uint)pPage << 1) + 1]));
    if (pPage_00->leaf == '\0') {
      *(undefined4 *)pCell = *(undefined4 *)pCell_00;
    }
    szNew = clearCell(pPage_00,pCell_00,(CellInfo *)local_90);
    if ((info.pPayload._6_2_ == pPage._4_4_) && (info.pPayload._4_2_ == (uint)info.pPayload)) {
      if (pCell_00 + (int)pPage._4_4_ <= pPage_00->aDataEnd) {
        memcpy(pCell_00,pCell,(long)(int)pPage._4_4_);
        return 0;
      }
      iVar3 = sqlite3CorruptError(0x1058f);
      return iVar3;
    }
    dropCell(pPage_00,(uint)pPage,(uint)info.pPayload._6_2_,&szNew);
    if (szNew != 0) {
      return szNew;
    }
  }
  else {
    szNew = 0;
    if ((idx < 0) && (pPage_00->nCell != 0)) {
      lVar5 = (long)(char)pX_local[1].nZero;
      uVar2 = *(short *)((long)&pX_local[2].pData + lVar5 * 2) + 1;
      *(ushort *)((long)&pX_local[2].pData + lVar5 * 2) = uVar2;
      pPage._0_4_ = (uint)uVar2;
    }
  }
  insertCell(pPage_00,(uint)pPage,pCell,pPage._4_4_,(u8 *)0x0,0,&szNew);
  *(undefined2 *)((long)&pX_local[1].pKey + 6) = 0;
  if (pPage_00->nOverflow != '\0') {
    *(byte *)&pX_local[1].nData = (byte)pX_local[1].nData & 0xfd;
    szNew = balance((BtCursor *)pX_local);
    *(undefined1 *)((&pX_local[3].nKey)[(char)pX_local[1].nZero] + 0xc) = 0;
    *(undefined1 *)((long)&pX_local[1].nData + 2) = 0;
    if (((rc & 2U) != 0) && (szNew == 0)) {
      szNew = moveToRoot((BtCursor *)pX_local);
      if (pX_local[2].pKey != (void *)0x0) {
        pvVar4 = sqlite3Malloc(_seekResult_local->nKey);
        pX_local[1].pData = pvVar4;
        if (pX_local[1].pData == (void *)0x0) {
          szNew = 7;
        }
        else {
          memcpy(pX_local[1].pData,_seekResult_local->pKey,_seekResult_local->nKey);
        }
      }
      *(undefined1 *)((long)&pX_local[1].nData + 2) = 3;
      pX_local[1].nKey = _seekResult_local->nKey;
    }
  }
  return szNew;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.  */
    assert( (flags & BTREE_SAVEPOSITION)==0 || 
            ((pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey) );

    /* If the cursor is currently on the last row and we are appending a
    ** new row onto the end, set the "loc" to avoid an unnecessary
    ** btreeMoveto() call */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      loc = 0;
    }else if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey>0
               && pCur->info.nKey==pX->nKey-1 ){
      loc = -1;
    }else if( loc==0 ){
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
    if( pX->nMem ){
      UnpackedRecord r;
      r.pKeyInfo = pCur->pKeyInfo;
      r.aMem = pX->aMem;
      r.nField = pX->nMem;
      r.default_rc = 0;
      r.errCode = 0;
      r.r1 = 0;
      r.r2 = 0;
      r.eqSeen = 0;
      rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
    }else{
      rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
    }
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->aiIdx[pCur->iPage];
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->aiIdx[pCur->iPage];
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->apPage[pCur->iPage]->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      rc = moveToRoot(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->apPage[pCur->iPage]->nOverflow==0 );

end_insert:
  return rc;
}